

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_block.cpp
# Opt level: O1

void msd_D<1024u>(uchar **strings,size_t n,size_t depth)

{
  size_t *psVar1;
  byte bVar2;
  _List_node_base *p_Var3;
  ulong uVar4;
  _List_node_base *__dest;
  size_t n_00;
  pointer ppppuVar5;
  uint j;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint i;
  long lVar11;
  undefined **ppuVar12;
  uchar **ppuVar13;
  uint i_1;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  BackLinks backlinks;
  uchar cache [32];
  array<unsigned_long,_256UL> bucketsize;
  _List_node_base *local_8b0;
  vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> local_880;
  ulong local_868;
  long local_860;
  byte abStack_858 [40];
  ulong local_830;
  size_t local_828 [255];
  
  if (n < 0x10000) {
    msd_CE2_16bit(strings,n,depth);
    return;
  }
  if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_ == '\0') {
    msd_D<1024u>();
  }
  if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_ == '\0') {
    msd_D<1024u>();
  }
  std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
            (&local_880,(n >> 10) + 1,(allocator_type *)&local_830);
  lVar11 = 0;
  do {
    (&local_830)[lVar11] = 0;
    p_Var6 = (_List_node_base *)
             (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
             + lVar11);
    p_Var7 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)&p_Var6->_M_next)
             ->_M_impl)._M_node.super__List_node_base._M_next;
    while (p_Var7 != p_Var6) {
      p_Var3 = p_Var7->_M_next;
      operator_delete(p_Var7);
      p_Var7 = p_Var3;
    }
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems[lVar11].
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
    super__List_node_base._M_prev = p_Var6;
    p_Var6->_M_next = p_Var6;
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems[lVar11].
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size =
         0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x100);
  ppuVar12 = (undefined **)0x0;
  do {
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next =
         (_List_node_base *)((long)msd_D<1024U>::temp_space._M_elems + (long)ppuVar12);
    std::__detail::_List_node_base::_M_hook(p_Var6);
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size =
         msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
         super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
         _M_size + 1;
    ppuVar12 = ppuVar12 + 0x400;
  } while (ppuVar12 != &_GLOBAL_OFFSET_TABLE_);
  if (n != 0x400) {
    uVar14 = 0;
    p_Var6 = (_List_node_base *)strings;
    do {
      p_Var7 = (_List_node_base *)operator_new(0x18);
      p_Var7[1]._M_next = p_Var6;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
      super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size
           = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             _M_size + 1;
      uVar14 = uVar14 + 0x400;
      p_Var6 = p_Var6 + 0x200;
    } while (uVar14 < n - 0x400);
  }
  local_868 = n & 0xffffffffffffffe0;
  if (local_868 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    ppuVar13 = strings;
    do {
      lVar11 = 0;
      do {
        abStack_858[lVar11] = ppuVar13[lVar11][depth];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      lVar11 = 0;
      do {
        p_Var6 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        bVar2 = abStack_858[lVar11];
        uVar4 = (&local_830)[bVar2];
        uVar15 = uVar4 & 0x3ff;
        if (uVar15 == 0) {
          if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              super__List_node_base._M_next ==
              (_List_node_base *)
              &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_)
          goto LAB_00194fa2;
          p_Var7 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                   super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   _M_node.super__List_node_base._M_next[1]._M_next;
          msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_
                    .super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var6);
          p_Var6 = (_List_node_base *)operator_new(0x18);
          p_Var6[1]._M_next = p_Var7;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                    _M_elems[bVar2].
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (p_Var7 < (_List_node_base *)(strings + n) && strings <= p_Var7) {
            lVar8 = (long)p_Var7 - (long)strings >> 3;
            lVar9 = lVar8 + 0x3ff;
            if (-1 < lVar8) {
              lVar9 = lVar8;
            }
            local_880.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar9 >> 10] =
                 (uchar ***)
                 (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                  _M_elems[bVar2].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_prev + 1);
          }
        }
        if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
             &((_List_node_base *)
              (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
               _M_elems + bVar2))->_M_next)->_M_impl)._M_node.super__List_node_base._M_next ==
            (_List_node_base *)
            (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
            + bVar2)) {
          __assert_fail("not buckets[c].empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                        ,0x7a,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
        }
        (&(msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
           [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
           _M_node.super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar15] =
             (_List_node_base *)ppuVar13[lVar11];
        (&local_830)[bVar2] = uVar4 + 1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      uVar14 = uVar14 + 0x20;
      ppuVar13 = ppuVar13 + 0x20;
    } while (uVar14 < local_868);
  }
  if (uVar14 < n) {
    do {
      p_Var6 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
               super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node
               .super__List_node_base._M_next;
      bVar2 = strings[uVar14][depth];
      uVar4 = (&local_830)[bVar2];
      uVar15 = uVar4 & 0x3ff;
      if (uVar15 == 0) {
        if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
            super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_) {
LAB_00194fa2:
          __assert_fail("not fb.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                        ,0x47,"Block take_free_block(FreeBlocks &)");
        }
        p_Var7 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next[1]._M_next;
        msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
        _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node._M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6);
        p_Var6 = (_List_node_base *)operator_new(0x18);
        p_Var6[1]._M_next = p_Var7;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                  _M_elems[bVar2].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (p_Var7 < (_List_node_base *)(strings + n) && strings <= p_Var7) {
          lVar9 = (long)p_Var7 - (long)strings >> 3;
          lVar11 = lVar9 + 0x3ff;
          if (-1 < lVar9) {
            lVar11 = lVar9;
          }
          local_880.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar11 >> 10] =
               (uchar ***)
               (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                _M_elems[bVar2].
                super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                _M_node.super__List_node_base._M_prev + 1);
        }
      }
      if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
           &((_List_node_base *)
            (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
            + bVar2))->_M_next)->_M_impl)._M_node.super__List_node_base._M_next ==
          (_List_node_base *)
          (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems +
          bVar2)) {
        __assert_fail("not buckets[c].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                      ,0x88,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
      }
      (&(msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
         [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
         _M_node.super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar15] =
           (_List_node_base *)strings[uVar14];
      (&local_830)[bVar2] = uVar4 + 1;
      uVar14 = uVar14 + 1;
    } while (n != uVar14);
  }
  p_Var6 = (_List_node_base *)(strings + n);
  lVar11 = 0;
  uVar14 = 0;
  do {
    uVar4 = (&local_830)[lVar11];
    local_860 = lVar11;
    if (uVar4 != 0) {
      local_8b0 = (_List_node_base *)
                  (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                   _M_elems + lVar11);
      uVar15 = 0;
      do {
        uVar16 = uVar4 - uVar15;
        if (0x3ff < uVar16) {
          uVar16 = 0x400;
        }
        local_8b0 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                     &local_8b0->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        p_Var7 = (_List_node_base *)(strings + uVar14);
        if (local_8b0[1]._M_next == p_Var7) {
          if ((uVar14 & 0x3ff) != 0) {
            __assert_fail("pos%B==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                          ,0x9b,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
          }
          *(undefined8 *)
           ((long)local_880.
                  super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar14 >> 7)) = 0;
        }
        else {
          uVar10 = (uVar16 + uVar14) - 1 >> 10;
          if (local_880.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10] != (uchar ***)0x0) {
            do {
              p_Var3 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                       freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next;
              if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_next ==
                  (_List_node_base *)
                  &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_)
              goto LAB_00194fa2;
              __dest = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                       freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next[1]._M_next;
              msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                        freeblocks_abi_cxx11_.
                        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl._M_node._M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var3);
              ppppuVar5 = local_880.
                          super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            } while ((strings <= __dest) && (__dest < p_Var7));
            local_868 = uVar14;
            if (__dest < p_Var6 && strings <= __dest) {
              lVar9 = (long)__dest - (long)strings >> 3;
              lVar11 = lVar9 + 0x3ff;
              if (-1 < lVar9) {
                lVar11 = lVar9;
              }
              if (local_880.
                  super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11 >> 10] != (uchar ***)0x0) {
                __assert_fail("backlinks[(tmp-strings)/B]==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                              ,0xac,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
              }
              local_880.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11 >> 10] =
                   local_880.
                   super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar10];
            }
            memcpy(__dest,*local_880.
                           super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10],0x2000);
            *ppppuVar5[uVar10] = (uchar **)__dest;
            local_880.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10] = (uchar ***)0x0;
            uVar14 = local_868;
          }
          p_Var3 = local_8b0[1]._M_next;
          if (p_Var3 < p_Var6 && strings <= p_Var3) {
            if (p_Var3 <= p_Var7) {
              __assert_fail("*it > strings+pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                            ,0xb5,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
            }
            lVar9 = (long)p_Var3 - (long)strings >> 3;
            lVar11 = lVar9 + 0x3ff;
            if (-1 < lVar9) {
              lVar11 = lVar9;
            }
            local_880.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11 >> 10] = (uchar ***)0x0;
          }
          memcpy(p_Var7,local_8b0[1]._M_next,uVar16 * 8);
          if (local_8b0[1]._M_next < p_Var6 && strings <= local_8b0[1]._M_next) {
            p_Var7 = (_List_node_base *)operator_new(0x18);
            p_Var7[1]._M_next = local_8b0[1]._M_next;
          }
          else {
            p_Var7 = (_List_node_base *)operator_new(0x18);
            p_Var7[1]._M_next = local_8b0[1]._M_next;
          }
          std::__detail::_List_node_base::_M_hook(p_Var7);
          msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_
                    .super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size + 1;
        }
        uVar14 = uVar14 + uVar16;
        uVar15 = uVar15 + 0x400;
      } while (uVar15 < uVar4);
    }
    lVar11 = local_860 + 1;
    p_Var7 = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (lVar11 == 0x100) {
      while (p_Var7 != (_List_node_base *)
                       &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                        freeblocks_abi_cxx11_) {
        p_Var6 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                  &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var7);
        p_Var7 = p_Var6;
      }
      msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
      super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           (_List_node_base *)
           &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
      msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
      super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
      super__List_node_base._M_next =
           (_List_node_base *)
           &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
      msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
      super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size
           = 0;
      lVar11 = 1;
      do {
        n_00 = (&local_830)[lVar11];
        if (n_00 != 0) {
          msd_D<1024u>(strings + local_830,n_00,depth + 1);
          local_830 = local_830 + n_00;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x100);
      if (local_880.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_880.
                        super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 0x10000) {
		msd_CE2_16bit(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, (256+6)*B> temp_space;
	static FreeBlocks freeblocks;
	BackLinks backlinks(n/B+1);
	std::array<size_t, 256> bucketsize;

	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = 0;
		buckets[i].clear();
	}

	// Initialize our list of free blocks.
	for (size_t i=0; i < 256+6; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-B; i+=B)
		freeblocks.push_back(&strings[i]);

	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			const unsigned char c = cache[j];
			if (bucketsize[c] % B == 0) {
				Block b = take_free_block(freeblocks);
				buckets[c].push_back(b);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (b >= strings && b < strings+n) {
					backlinks[(b-strings)/B] = &(buckets[c].back());
				}
			}
			assert(not buckets[c].empty());
			buckets[c].back()[bucketsize[c] % B] = strings[i+j];
			++bucketsize[c];
		}
	}
	for (; i < n; ++i) {
		const unsigned char c = strings[i][depth];
		if (bucketsize[c] % B == 0) {
			Block b = take_free_block(freeblocks);
			buckets[c].push_back(b);
			if (b >= strings && b < strings+n) {
				backlinks[(b-strings)/B] = &(buckets[c].back());
			}
		}
		assert(not buckets[c].empty());
		buckets[c].back()[bucketsize[c] % B] = strings[i];
		++bucketsize[c];
	}

	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;

		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;

			if (*it == (strings+pos)) {
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}

			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}

			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}

			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));

			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}

			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear();
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<B>(strings+pos, bucketsize[i], depth+1);
		pos += bucketsize[i];
	}
}